

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O3

void __thiscall
soplex::SPxWeightST<double>::generate(SPxWeightST<double> *this,SPxSolverBase<double> *base)

{
  DataArray<int> *pDVar1;
  Array<double> *this_00;
  double *pdVar2;
  double dVar3;
  uint uVar4;
  SVSetBase<double> *pSVar5;
  int *piVar6;
  Array<double> *pAVar7;
  uint uVar8;
  long lVar9;
  SVectorBase<double> *pSVar10;
  ulong uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Nonzero<double> *pNVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  Array<double> *pAVar20;
  long lVar21;
  ulong uVar22;
  bool bVar23;
  Real RVar24;
  Array<double> *pAVar25;
  SPxId tmpId;
  ulong local_130;
  SPxId *local_110;
  undefined8 local_108;
  int local_fc;
  DataKey local_f8;
  DataKey local_f0;
  double local_e8;
  undefined8 uStack_e0;
  Array<double> *local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  SVectorBase<double> *local_c0;
  DataKey local_b8;
  int *local_b0;
  undefined8 local_a8;
  DataArray<int> *local_a0;
  DataKey local_98;
  int local_90;
  int local_8c;
  int *local_88;
  undefined8 local_80;
  Compare<double> local_78;
  Desc local_70;
  
  local_98.info = 0;
  local_98.idx = -1;
  pDVar1 = &this->forbidden;
  DataArray<int>::reSize(pDVar1,(base->thecovectors->set).thenum);
  pAVar25 = &this->rowWeight;
  std::vector<double,_std::allocator<double>_>::resize
            (&pAVar25->data,
             (long)(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum);
  this_00 = &this->colWeight;
  std::vector<double,_std::allocator<double>_>::resize
            (&this_00->data,
             (long)(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum);
  DataArray<bool>::reSize
            (&this->rowRight,
             (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             thenum);
  DataArray<bool>::reSize
            (&this->colUp,
             (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum);
  pAVar20 = this_00;
  pAVar7 = pAVar25;
  if (base->theRep == COLUMN) {
    pAVar20 = pAVar25;
    pAVar7 = this_00;
  }
  this->weight = pAVar7;
  this->coWeight = pAVar20;
  local_d8 = pAVar25;
  (*(this->super_SPxStarter<double>)._vptr_SPxStarter[8])(this,base);
  SPxBasisBase<double>::Desc::Desc(&local_70,base);
  iVar14 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
           thenum + (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                    super_SVSetBase<double>.set.thenum;
  local_110 = (SPxId *)0x0;
  local_108 = 0x3ff3333333333333;
  iVar15 = iVar14;
  if (iVar14 < 1) {
    iVar15 = 0;
    iVar14 = 1;
  }
  spx_alloc<soplex::SPxId*>(&local_110,iVar14);
  local_b8.idx = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                 set.thenum;
  local_b0 = (int *)0x0;
  local_a8 = 0x3ff3333333333333;
  local_b8.info = local_b8.idx;
  if (local_b8.idx < 1) {
    local_b8.idx = 1;
    local_b8.info = 0;
  }
  spx_alloc<int*>(&local_b0,local_b8.idx);
  iVar14 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
           thenum;
  local_88 = (int *)0x0;
  local_80 = 0x3ff3333333333333;
  local_90 = 0;
  if (0 < iVar14) {
    local_90 = iVar14;
  }
  local_8c = 1;
  if (0 < iVar14) {
    local_8c = local_90;
  }
  spx_alloc<int*>(&local_88,local_8c);
  if (0 < (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    lVar9 = 0;
    do {
      local_b0[lVar9] = (int)lVar9;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
  }
  local_78.weight =
       (local_d8->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  SPxQuicksort<int,soplex::Compare<double>>(local_b0,local_b8.info,&local_78,0,true);
  if (0 < (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    lVar9 = 0;
    do {
      local_88[lVar9] = (int)lVar9;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
  }
  local_78.weight =
       (this_00->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  SPxQuicksort<int,soplex::Compare<double>>(local_88,local_90,&local_78,0,true);
  local_a0 = pDVar1;
  if (0 < iVar15) {
    uVar22 = 0;
    iVar14 = 0;
    local_e8 = (double)((ulong)local_e8 & 0xffffffff00000000);
    do {
      lVar21 = (long)local_e8._0_4_;
      lVar9 = (long)iVar14;
      dVar3 = (this_00->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_88[lVar9]];
      pdVar2 = (local_d8->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + local_b0[lVar21];
      iVar19 = (int)uVar22;
      if (dVar3 < *pdVar2 || dVar3 == *pdVar2) {
        local_f8 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thekey[local_88[lVar9]];
        SPxColId::SPxColId((SPxColId *)&local_f0,&local_f8);
        iVar14 = iVar14 + 1;
        local_110[iVar19].super_DataKey = local_f0;
        local_110[iVar19].super_DataKey.info = 1;
        uVar17 = iVar19 + 1;
        uVar22 = (ulong)uVar17;
        if (((base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum <= iVar14) && ((int)uVar17 < iVar15)) {
          local_c0 = (SVectorBase<double> *)CONCAT44(local_c0._4_4_,iVar14);
          uVar11 = (long)(int)uVar17;
          do {
            local_f8 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                       super_SVSetBase<double>.set.thekey[local_b0[lVar21]];
            SPxRowId::SPxRowId((SPxRowId *)&local_f0,&local_f8);
            lVar21 = lVar21 + 1;
            uVar22 = uVar11 + 1;
            local_110[uVar11].super_DataKey = local_f0;
            local_110[uVar11].super_DataKey.info = -1;
            uVar11 = uVar22;
          } while ((long)uVar22 < (long)iVar15);
          local_e8 = (double)CONCAT44(local_e8._4_4_,(int)lVar21);
          iVar14 = (int)local_c0;
        }
      }
      else {
        local_f8 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thekey[local_b0[lVar21]];
        SPxRowId::SPxRowId((SPxRowId *)&local_f0,&local_f8);
        iVar16 = local_e8._0_4_ + 1;
        local_110[iVar19].super_DataKey = local_f0;
        local_110[iVar19].super_DataKey.info = -1;
        uVar17 = iVar19 + 1;
        uVar22 = (ulong)uVar17;
        local_e8 = (double)CONCAT44(local_e8._4_4_,iVar16);
        if (((base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             thenum <= iVar16) && ((int)uVar17 < iVar15)) {
          uVar11 = (long)(int)uVar17;
          do {
            local_f8 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thekey[local_88[lVar9]];
            SPxColId::SPxColId((SPxColId *)&local_f0,&local_f8);
            lVar9 = lVar9 + 1;
            uVar22 = uVar11 + 1;
            local_110[uVar11].super_DataKey = local_f0;
            local_110[uVar11].super_DataKey.info = 1;
            uVar11 = uVar22;
          } while ((long)uVar22 < (long)iVar15);
          iVar14 = (int)lVar9;
        }
      }
    } while ((int)uVar22 < iVar15);
  }
  if (local_88 != (int *)0x0) {
    free(local_88);
  }
  if (local_b0 != (int *)0x0) {
    free(local_b0);
  }
  pSVar5 = base->thecovectors;
  uVar17 = (pSVar5->set).thenum;
  local_130 = (ulong)uVar17;
  if (0 < (int)uVar17) {
    piVar6 = (this->forbidden).data;
    lVar9 = 0;
    do {
      piVar6[lVar9] = 0;
      lVar9 = lVar9 + 1;
      local_130 = (ulong)(pSVar5->set).thenum;
    } while (lVar9 < (long)local_130);
  }
  bVar23 = base->theRep == COLUMN;
  uVar22 = 0;
  if (!bVar23) {
    uVar22 = (ulong)(iVar15 - 1);
  }
  iVar14 = (int)uVar22;
  if (iVar14 < iVar15 && -1 < iVar14) {
    iVar19 = (uint)bVar23 * 2 + -1;
    uVar17 = iVar14 + iVar19;
    local_d8 = (Array<double> *)0x0;
    uStack_d0 = 0;
    local_fc = iVar19;
    do {
      local_98 = local_110[uVar22].super_DataKey;
      pSVar10 = SPxSolverBase<double>::vector(base,(SPxId *)&local_98);
      uVar8 = pSVar10->memused;
      uVar11 = (ulong)uVar8;
      if (uVar11 == 1) {
        uVar8 = pSVar10->m_elem->idx;
        iVar14 = (this->forbidden).data[(int)uVar8];
        if (1 < iVar14) goto LAB_0022c397;
        local_130 = (ulong)((int)local_130 + (uint)(iVar14 == 1));
LAB_0022c277:
        if ((int)uVar8 < 0) goto LAB_0022c397;
        (this->forbidden).data[uVar8] = 2;
        if (base->theRep == COLUMN) {
          setDualStatus<double>(&local_70,base,local_110 + uVar22);
        }
        else {
          setPrimalStatus(this,&local_70,base,local_110 + uVar22);
        }
        lVar9 = (long)pSVar10->memused;
        local_c8 = uVar22;
        if (0 < lVar9) {
          uVar22 = lVar9 + 1;
          lVar9 = lVar9 * 0x10 + -8;
          do {
            local_e8 = *(double *)((long)pSVar10->m_elem + lVar9 + -8);
            uStack_e0 = 0;
            iVar14 = *(int *)((long)&pSVar10->m_elem->val + lVar9);
            iVar19 = (*(this->super_SPxStarter<double>)._vptr_SPxStarter[6])(this);
            RVar24 = Tolerances::floatingPointFeastol
                               (*(Tolerances **)CONCAT44(extraout_var_00,iVar19));
            piVar6 = (this->forbidden).data;
            if ((piVar6[iVar14] == 0) &&
               ((RVar24 * (double)local_d8 < local_e8 || (RVar24 * (double)local_d8 < -local_e8))))
            {
              piVar6[iVar14] = 1;
              local_130 = (ulong)((int)local_130 - 1);
            }
            uVar22 = uVar22 - 1;
            lVar9 = lVar9 + -0x10;
          } while (1 < uVar22);
        }
        pDVar1 = local_a0;
        iVar14 = local_fc;
        uVar8 = (int)local_130 - 1;
        local_130 = (ulong)uVar8;
        uVar22 = local_c8;
        iVar19 = local_fc;
        if (uVar8 == 0) {
          if (base->theRep == COLUMN) {
            while ((-1 < (int)uVar17 && ((int)uVar17 < iVar15))) {
              uVar22 = (ulong)uVar17;
              uVar17 = uVar17 + iVar14;
              setPrimalStatus(this,&local_70,base,local_110 + uVar22);
            }
            if (0 < (long)local_a0->thesize) {
              uVar22 = (long)local_a0->thesize;
              do {
                if ((this->forbidden).data[uVar22 - 1] < 2) {
                  local_b8 = (DataKey)SPxSolverBase<double>::coId(base,(int)uVar22 + -1);
                  setDualStatus<double>(&local_70,base,(SPxId *)&local_b8);
                }
                bVar23 = 1 < uVar22;
                uVar22 = uVar22 - 1;
              } while (bVar23);
            }
          }
          else {
            while ((-1 < (int)uVar17 && ((int)uVar17 < iVar15))) {
              uVar22 = (ulong)uVar17;
              uVar17 = uVar17 + iVar14;
              setDualStatus<double>(&local_70,base,local_110 + uVar22);
            }
            if (0 < (long)pDVar1->thesize) {
              uVar22 = (long)pDVar1->thesize;
              do {
                if ((this->forbidden).data[uVar22 - 1] < 2) {
                  local_b8 = (DataKey)SPxSolverBase<double>::coId(base,(int)uVar22 + -1);
                  setPrimalStatus(this,&local_70,base,(SPxId *)&local_b8);
                }
                bVar23 = 1 < uVar22;
                uVar22 = uVar22 - 1;
              } while (bVar23);
            }
          }
          break;
        }
      }
      else {
        if ((int)uVar8 < 1) {
          local_d8 = (Array<double> *)0x0;
          uStack_d0 = 0;
        }
        else {
          uVar18 = uVar11 + 1;
          pNVar12 = pSVar10->m_elem + uVar11;
          uVar13 = uVar18;
          pAVar25 = (Array<double> *)0x0;
          do {
            pNVar12 = pNVar12 + -1;
            local_d8 = (Array<double> *)ABS(pNVar12->val);
            if (ABS(pNVar12->val) <= (double)pAVar25) {
              local_d8 = pAVar25;
            }
            uVar13 = uVar13 - 1;
            pAVar25 = local_d8;
          } while (1 < uVar13);
          uStack_d0 = 0;
          if (0 < (int)uVar8) {
            iVar14 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set.thenum;
            lVar9 = uVar11 * 0x10 + -8;
            uVar8 = 0xffffffff;
            local_c8 = uVar22;
            local_c0 = pSVar10;
            do {
              uVar4 = *(uint *)((long)&pSVar10->m_elem->val + lVar9);
              if ((this->forbidden).data[(int)uVar4] == 0) {
                iVar19 = (base->thecovectors->set).theitem
                         [(base->thecovectors->set).thekey[(int)uVar4].idx].data.
                         super_SVectorBase<double>.memused;
                local_e8 = *(double *)((long)pSVar10->m_elem + lVar9 + -8);
                uStack_e0 = 0;
                iVar16 = (*(this->super_SPxStarter<double>)._vptr_SPxStarter[6])();
                dVar3 = *(double *)(*(long *)CONCAT44(extraout_var,iVar16) + 0x40);
                uVar22 = -(ulong)(dVar3 == 1.0);
                pSVar10 = local_c0;
                if ((double)(~uVar22 & (ulong)(dVar3 * 0.001) | uVar22 & 0x3f50624dd2f1a9fc) *
                    (double)local_d8 < ABS(local_e8) && iVar19 < iVar14) {
                  iVar14 = iVar19;
                  uVar8 = uVar4;
                }
              }
              uVar18 = uVar18 - 1;
              lVar9 = lVar9 + -0x10;
              uVar22 = local_c8;
              iVar19 = local_fc;
            } while (1 < uVar18);
            goto LAB_0022c277;
          }
        }
LAB_0022c397:
        if (base->theRep == COLUMN) {
          setPrimalStatus(this,&local_70,base,local_110 + uVar22);
        }
        else {
          setDualStatus<double>(&local_70,base,local_110 + uVar22);
        }
      }
      uVar8 = (int)uVar22 + iVar19;
      uVar22 = (ulong)uVar8;
    } while ((-1 < (int)uVar8) && (uVar17 = uVar17 + iVar19, (int)uVar8 < iVar15));
  }
  (*(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x58])(base,&local_70);
  if (local_110 != (SPxId *)0x0) {
    free(local_110);
  }
  if (local_70.colstat.data != (Status *)0x0) {
    free(local_70.colstat.data);
    local_70.colstat.data = (Status *)0x0;
  }
  if (local_70.rowstat.data != (Status *)0x0) {
    free(local_70.rowstat.data);
  }
  return;
}

Assistant:

void SPxWeightST<R>::generate(SPxSolverBase<R>& base)
{
   SPxId tmpId;

   forbidden.reSize(base.dim());
   rowWeight.reSize(base.nRows());
   colWeight.reSize(base.nCols());
   rowRight.reSize(base.nRows());
   colUp.reSize(base.nCols());

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      weight   = &colWeight;
      coWeight = &rowWeight;
   }
   else
   {
      weight   = &rowWeight;
      coWeight = &colWeight;
   }

   assert(weight->size()   == base.coDim());
   assert(coWeight->size() == base.dim());

   setupWeights(base);

   typename SPxBasisBase<R>::Desc desc(base);
   //   desc.reSize(base.nRows(), base.nCols());

   DataArray < SPxId > pref(base.nRows() + base.nCols());
   initPrefs(pref, base, rowWeight, colWeight);

   int i;
   int stepi;
   int j;
   int sel;

   for(i = 0; i < base.dim(); ++i)
      forbidden[i] = 0;

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      // in COLUMN rep we scan from beginning to end
      i      = 0;
      stepi = 1;
   }
   else
   {
      // in ROW rep we scan from end to beginning
      i      = pref.size() - 1;
      stepi = -1;
   }

   int  dim = base.dim();
   R maxEntry = 0;

   for(; i >= 0 && i < pref.size(); i += stepi)
   {
      tmpId              = pref[i];
      const SVectorBase<R>& vec = base.vector(tmpId);
      sel                = -1;

      // column or row singleton ?
      if(vec.size() == 1)
      {
         int idx = vec.index(0);

         if(forbidden[idx] < 2)
         {
            sel  = idx;
            dim += (forbidden[idx] > 0) ? 1 : 0;
         }
      }
      else
      {
         maxEntry = vec.maxAbs();

         // initialize the nonzero counter
         int minRowEntries = base.nRows();

         // find a stable index with a sparse row/column
         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            int  nRowEntries = base.coVector(k).size();

            if(!forbidden[k]
                  && (spxAbs(x) > this->tolerances()->scaleAccordingToEpsilon(SOPLEX_STABLE) * maxEntry)
                  && (nRowEntries < minRowEntries))
            {
               minRowEntries = nRowEntries;
               sel  = k;
            }
         }
      }

      // we found a valid index
      if(sel >= 0)
      {
         SPX_DEBUG(

            if(pref[i].type() == SPxId::ROW_ID)
            std::cout << "DWEIST01 r" << base.number(pref[i]);
            else
               std::cout << "DWEIST02 c" << base.number(pref[i]);
            )

               forbidden[sel] = 2;

         // put current column/row into basis
         if(base.rep() == SPxSolverBase<R>::COLUMN)
            setDualStatus(desc, base, pref[i]);
         else
            setPrimalStatus(desc, base, pref[i]);

         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            R feastol = this->tolerances()->floatingPointFeastol();

            if(!forbidden[k] && (x > feastol * maxEntry || -x > feastol * maxEntry))
            {
               forbidden[k] = 1;
               --dim;
            }
         }

         if(--dim == 0)
         {
            //@ for(++i; i < pref.size(); ++i)
            if(base.rep() == SPxSolverBase<R>::COLUMN)
            {
               // set all remaining indeces to nonbasic status
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setPrimalStatus(desc, base, pref[i]);

               // fill up the basis wherever linear independence is assured
               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setDualStatus(desc, base, base.coId(i));
               }
            }
            else
            {
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setDualStatus(desc, base, pref[i]);

               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setPrimalStatus(desc, base, base.coId(i));
               }
            }

            break;
         }
      }
      // sel == -1
      else if(base.rep() == SPxSolverBase<R>::COLUMN)
         setPrimalStatus(desc, base, pref[i]);
      else
         setDualStatus(desc, base, pref[i]);

#ifndef NDEBUG
      {
         int n, m;

         for(n = 0, m = forbidden.size(); n < forbidden.size(); ++n)
            m -= (forbidden[n] != 0) ? 1 : 0;

         assert(m == dim);
      }
#endif  // NDEBUG
   }

   assert(dim == 0);

   base.loadBasis(desc);
#ifdef  TEST
   base.init();

   int changed = 0;
   const VectorBase<R>& pvec = base.pVec();

   for(i = pvec.dim() - 1; i >= 0; --i)
   {
      if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_UPPER
            && base.lower(i) > R(-infinity) && pvec[i] > base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
      else if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
              && base.upper(i) < R(infinity) && pvec[i] < base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      }
   }

   if(changed)
   {
      std::cout << "changed basis\n";
      base.loadBasis(desc);
   }
   else
      std::cout << "nothing changed\n";

#endif  // TEST
}